

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

int util::compareChar(char *str1,char *str2)

{
  ulong uVar1;
  unsigned_long *puVar2;
  size_t sVar3;
  size_t sVar4;
  size_t local_38;
  size_t local_30;
  int local_24;
  char *pcStack_20;
  int i;
  char *str2_local;
  char *str1_local;
  
  local_24 = 0;
  pcStack_20 = str2;
  str2_local = str1;
  while( true ) {
    uVar1 = (ulong)local_24;
    local_30 = strlen(str2_local);
    local_38 = strlen(pcStack_20);
    puVar2 = std::min<unsigned_long>(&local_30,&local_38);
    if (*puVar2 <= uVar1) {
      sVar3 = strlen(pcStack_20);
      sVar4 = strlen(str2_local);
      if (sVar4 < sVar3) {
        str1_local._4_4_ = -1;
      }
      else {
        sVar3 = strlen(pcStack_20);
        sVar4 = strlen(str2_local);
        if (sVar3 == sVar4) {
          str1_local._4_4_ = 0;
        }
        else {
          str1_local._4_4_ = 1;
        }
      }
      return str1_local._4_4_;
    }
    if (str2_local[local_24] < pcStack_20[local_24]) break;
    if (pcStack_20[local_24] < str2_local[local_24]) {
      return 1;
    }
    local_24 = local_24 + 1;
  }
  return -1;
}

Assistant:

int util::compareChar(const char* str1, const char* str2){

    for(int i = 0 ; i < min(strlen(str1), strlen(str2)); i++){
        if(str1[i] < str2[i])
            return -1;
        else if (str1[i] > str2[i])
            return 1;
    }
    if(strlen(str2) > strlen(str1))
        return -1;
    else if(strlen(str2) == strlen(str1))
        return 0;
    return 1;
}